

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.c
# Opt level: O3

void read_32_xrgb_8888_line(ALLEGRO_FILE *f,char *buf,char *data,int length,_Bool premul)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  
  lVar2 = al_fread(f,buf,(long)(length * 4));
  memset(buf + lVar2,0,length * 4 - lVar2);
  if (0 < length) {
    uVar3 = 0;
    do {
      uVar1 = *(uint *)(buf + uVar3 * 4);
      *(uint *)(data + uVar3 * 4) =
           uVar1 >> 0x10 & 0xff | uVar1 & 0xff00 | uVar1 << 0x10 | 0xff000000;
      uVar3 = uVar3 + 1;
    } while ((uint)length != uVar3);
  }
  return;
}

Assistant:

static void read_32_xrgb_8888_line(ALLEGRO_FILE *f, char *buf, char *data,
   int length, bool premul)
{
   int i;
   uint32_t *data32 = (uint32_t *)data;
   size_t bytes_wanted = length * 4;

   size_t bytes_read = al_fread(f, buf, bytes_wanted);
   memset(buf + bytes_read, 0, bytes_wanted - bytes_read);

   (void)premul;

   for (i = 0; i < length; i++) {
      uint32_t pixel = read_32le(buf + i*4);
      data32[i] = ALLEGRO_CONVERT_XRGB_8888_TO_ABGR_8888_LE(pixel);
   }
}